

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::Array<unsigned_char>_> * __thiscall
kj::_::ExceptionOr<kj::Array<unsigned_char>_>::operator=
          (ExceptionOr<kj::Array<unsigned_char>_> *this,
          ExceptionOr<kj::Array<unsigned_char>_> *param_1)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      puVar1 = (this->value).ptr.field_1.value.ptr;
      if (puVar1 != (uchar *)0x0) {
        sVar2 = (this->value).ptr.field_1.value.size_;
        (this->value).ptr.field_1.value.ptr = (uchar *)0x0;
        (this->value).ptr.field_1.value.size_ = 0;
        pAVar3 = (this->value).ptr.field_1.value.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.ptr = (param_1->value).ptr.field_1.value.ptr;
      (this->value).ptr.field_1.value.size_ = (param_1->value).ptr.field_1.value.size_;
      (this->value).ptr.field_1.value.disposer = (param_1->value).ptr.field_1.value.disposer;
      (param_1->value).ptr.field_1.value.ptr = (uchar *)0x0;
      (param_1->value).ptr.field_1.value.size_ = 0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    puVar1 = (param_1->value).ptr.field_1.value.ptr;
    if (puVar1 != (uchar *)0x0) {
      sVar2 = (param_1->value).ptr.field_1.value.size_;
      (param_1->value).ptr.field_1.value.ptr = (uchar *)0x0;
      (param_1->value).ptr.field_1.value.size_ = 0;
      pAVar3 = (param_1->value).ptr.field_1.value.disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;